

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap256.h
# Opt level: O0

int __thiscall re2::Bitmap256::FindNextSetBit(Bitmap256 *this,int c)

{
  int iVar1;
  ulong n;
  int iVar2;
  int in_ESI;
  long in_RDI;
  uint64_t word;
  int i;
  
  iVar2 = in_ESI / 0x40;
  n = *(ulong *)(in_RDI + (long)iVar2 * 8) & -1L << ((byte)((long)in_ESI % 0x40) & 0x3f);
  if (n != 0) {
    iVar1 = FindLSBSet(n);
    return iVar2 * 0x40 + iVar1;
  }
  if (iVar2 == 0) {
    if (*(long *)(in_RDI + 8) != 0) {
      iVar2 = FindLSBSet(*(uint64_t *)(in_RDI + 8));
      return iVar2 + 0x40;
    }
  }
  else if (iVar2 != 1) {
    if (iVar2 != 2) {
      return -1;
    }
    goto LAB_0024202a;
  }
  if (*(long *)(in_RDI + 0x10) != 0) {
    iVar2 = FindLSBSet(*(uint64_t *)(in_RDI + 0x10));
    return iVar2 + 0x80;
  }
LAB_0024202a:
  if (*(long *)(in_RDI + 0x18) == 0) {
    return -1;
  }
  iVar2 = FindLSBSet(*(uint64_t *)(in_RDI + 0x18));
  return iVar2 + 0xc0;
}

Assistant:

int Bitmap256::FindNextSetBit(int c) const {
  DCHECK_GE(c, 0);
  DCHECK_LE(c, 255);

  // Check the word that contains the bit. Mask out any lower bits.
  int i = c / 64;
  uint64_t word = words_[i] & (~0ULL << (c % 64));
  if (word != 0)
    return (i * 64) + FindLSBSet(word);

  // Check any following words.
  i++;
  switch (i) {
    case 1:
      if (words_[1] != 0)
        return (1 * 64) + FindLSBSet(words_[1]);
      FALLTHROUGH_INTENDED;
    case 2:
      if (words_[2] != 0)
        return (2 * 64) + FindLSBSet(words_[2]);
      FALLTHROUGH_INTENDED;
    case 3:
      if (words_[3] != 0)
        return (3 * 64) + FindLSBSet(words_[3]);
      FALLTHROUGH_INTENDED;
    default:
      return -1;
  }
}